

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::DropNotNullInfo::Deserialize(DropNotNullInfo *this,Deserializer *deserializer)

{
  uint uVar1;
  DropNotNullInfo *this_00;
  pointer pDVar2;
  pointer *__ptr;
  unique_ptr<duckdb::DropNotNullInfo,_std::default_delete<duckdb::DropNotNullInfo>,_true> result;
  _Head_base<0UL,_duckdb::DropNotNullInfo_*,_false> local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (DropNotNullInfo *)operator_new(0x98);
  DropNotNullInfo(this_00);
  local_58._M_head_impl = this_00;
  pDVar2 = unique_ptr<duckdb::DropNotNullInfo,_std::default_delete<duckdb::DropNotNullInfo>,_true>::
           operator->((unique_ptr<duckdb::DropNotNullInfo,_std::default_delete<duckdb::DropNotNullInfo>,_true>
                       *)&local_58);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,400,"column_name");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pDVar2->column_name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010be435;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pDVar2->column_name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010be435;
  }
  operator_delete(local_50);
LAB_010be435:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> DropNotNullInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<DropNotNullInfo>(new DropNotNullInfo());
	deserializer.ReadPropertyWithDefault<string>(400, "column_name", result->column_name);
	return std::move(result);
}